

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O3

UStringStream * __thiscall jsonnet::internal::UStringStream::operator<<(UStringStream *this,uint c)

{
  long lVar1;
  stringstream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  if (local_1c8 != 0) {
    lVar1 = 0;
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&this->buf,(int)*(char *)((long)local_1d0 + lVar1));
      lVar1 = lVar1 + 1;
    } while (local_1c8 != lVar1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return this;
}

Assistant:

UStringStream &operator<<(T c)
    {
        std::stringstream ss;
        ss << c;
        for (char c : ss.str())
            buf.push_back(char32_t(c));
        return *this;
    }